

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool CheckMerkleRoot(CBlock *block,BlockValidationState *state)

{
  bool bVar1;
  bool *in_RSI;
  CBlock *in_RDI;
  long in_FS_OFFSET;
  bool mutated;
  uint256 merkle_root;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  string *in_stack_fffffffffffffef8;
  string *reject_reason;
  undefined8 in_stack_ffffffffffffff00;
  BlockValidationResult result;
  BlockValidationResult result_00;
  ValidationState<BlockValidationResult> *in_stack_ffffffffffffff08;
  ValidationState<BlockValidationResult> *this;
  allocator<char> *in_stack_ffffffffffffff28;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  bool local_ae;
  undefined1 local_ad;
  undefined1 local_ac [2];
  allocator<char> local_aa;
  undefined1 local_a9;
  long local_8;
  
  result = (BlockValidationResult)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_checked_merkle_root & 1U) == 0) {
    BlockMerkleRoot(in_RDI,in_RSI);
    result_00 = (BlockValidationResult)((ulong)in_RSI >> 0x20);
    bVar1 = operator!=((base_blob<256U> *)in_stack_fffffffffffffef8,
                       (base_blob<256U> *)
                       CONCAT17(in_stack_fffffffffffffef7,
                                CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
    if (bVar1) {
      __a = &local_aa;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,__a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,__a);
      local_ae = ValidationState<BlockValidationResult>::Invalid
                           (in_stack_ffffffffffffff08,result,in_stack_fffffffffffffef8,
                            (string *)
                            CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)))
      ;
      std::__cxx11::string::~string(in_stack_fffffffffffffee8);
      std::allocator<char>::~allocator((allocator<char> *)(local_ac + 1));
      std::__cxx11::string::~string(in_stack_fffffffffffffee8);
      std::allocator<char>::~allocator(&local_aa);
    }
    else if ((local_a9 & 1) == M_VALID >> 0x18) {
      in_RDI->m_checked_merkle_root = true;
      local_ae = true;
    }
    else {
      this = (ValidationState<BlockValidationResult> *)local_ac;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      reject_reason = (string *)&local_ad;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      local_ae = ValidationState<BlockValidationResult>::Invalid
                           (this,result_00,reject_reason,
                            (string *)
                            CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)))
      ;
      std::__cxx11::string::~string(in_stack_fffffffffffffee8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ad);
      std::__cxx11::string::~string(in_stack_fffffffffffffee8);
      std::allocator<char>::~allocator((allocator<char> *)local_ac);
    }
  }
  else {
    local_ae = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_ae;
  }
  __stack_chk_fail();
}

Assistant:

static bool CheckMerkleRoot(const CBlock& block, BlockValidationState& state)
{
    if (block.m_checked_merkle_root) return true;

    bool mutated;
    uint256 merkle_root = BlockMerkleRoot(block, &mutated);
    if (block.hashMerkleRoot != merkle_root) {
        return state.Invalid(
            /*result=*/BlockValidationResult::BLOCK_MUTATED,
            /*reject_reason=*/"bad-txnmrklroot",
            /*debug_message=*/"hashMerkleRoot mismatch");
    }

    // Check for merkle tree malleability (CVE-2012-2459): repeating sequences
    // of transactions in a block without affecting the merkle root of a block,
    // while still invalidating it.
    if (mutated) {
        return state.Invalid(
            /*result=*/BlockValidationResult::BLOCK_MUTATED,
            /*reject_reason=*/"bad-txns-duplicate",
            /*debug_message=*/"duplicate transaction");
    }

    block.m_checked_merkle_root = true;
    return true;
}